

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

string * CLI::clean_name_string(string *name,string *keyChars)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  string *in_stack_00000018;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000020;
  char in_stack_ffffffffffffffcf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  undefined7 in_stack_ffffffffffffffd8;
  char in_stack_ffffffffffffffdf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe8;
  
  sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          find_first_of(in_RSI,in_stack_ffffffffffffffe8,(size_type)in_stack_ffffffffffffffe0);
  if ((sVar2 != 0xffffffffffffffff) ||
     (((pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 front(in_stack_ffffffffffffffd0), *pvVar3 == '[' &&
       (pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 back(in_stack_ffffffffffffffd0), *pvVar3 == ']')) ||
      (sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               find_first_of(in_RSI,(char *)in_stack_ffffffffffffffe8,
                             (size_type)in_stack_ffffffffffffffe0), sVar2 != 0xffffffffffffffff))))
  {
    sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find_first_of(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcf,0x187b1d);
    if (sVar2 == 0xffffffffffffffff) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
                (in_stack_ffffffffffffffe0,
                 CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8),
                 (size_type)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcf);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdf);
    }
    else {
      bVar1 = detail::has_escapable_character((string *)0x187b56);
      if (bVar1) {
        detail::add_escaped_characters(in_stack_00000018);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (in_stack_00000020,in_stack_00000018);
        ::std::__cxx11::string::~string(in_stack_ffffffffffffffd0);
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
                (in_stack_ffffffffffffffe0,
                 CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8),
                 (size_type)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcf);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdf);
    }
  }
  return in_RDI;
}

Assistant:

CLI11_INLINE std::string &clean_name_string(std::string &name, const std::string &keyChars) {
    if(name.find_first_of(keyChars) != std::string::npos || (name.front() == '[' && name.back() == ']') ||
       (name.find_first_of("'`\"\\") != std::string::npos)) {
        if(name.find_first_of('\'') == std::string::npos) {
            name.insert(0, 1, '\'');
            name.push_back('\'');
        } else {
            if(detail::has_escapable_character(name)) {
                name = detail::add_escaped_characters(name);
            }
            name.insert(0, 1, '\"');
            name.push_back('\"');
        }
    }
    return name;
}